

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QBackingStore * __thiscall QWidget::backingStore(QWidget *this)

{
  QWidget *pQVar1;
  long lVar2;
  
  do {
    lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
    if (lVar2 == 0) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)(lVar2 + 8);
    }
    if ((lVar2 != 0) && (*(QBackingStore **)(lVar2 + 0x10) != (QBackingStore *)0x0)) {
      return *(QBackingStore **)(lVar2 + 0x10);
    }
    pQVar1 = this;
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      return (QBackingStore *)0x0;
    }
    do {
      this = pQVar1;
      pQVar1 = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
      if (pQVar1 == (QWidget *)0x0) break;
    } while (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
  } while( true );
}

Assistant:

QBackingStore *QWidget::backingStore() const
{
    Q_D(const QWidget);
    QTLWExtra *extra = d->maybeTopData();
    if (extra && extra->backingStore)
        return extra->backingStore;

    if (!isWindow())
        return window()->backingStore();

    return nullptr;
}